

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall CompiledProjectOperator::~CompiledProjectOperator(CompiledProjectOperator *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  if (this->next_ != (BaseOperator *)0x0) {
    (*this->next_->_vptr_BaseOperator[1])();
  }
  pcVar1 = (this->col_name_)._M_dataplus._M_p;
  paVar2 = &(this->col_name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~CompiledProjectOperator() final {
        delete next_;
    }